

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O3

void eggs::variants::detail::
     _apply<void,CodeGeneratorData::generate()::$_0,eggs::variants::detail::pack<>,eggs::variants::detail::pack<eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,CompiledScmHeader,CustomHeaderOATC>,false,false>const&>>
     ::call<eggs::variants::detail::index<2ul>>
               (anon_class_8_1_8991fb9c *f,
               _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_CompiledScmHeader,_CustomHeaderOATC>,_false,_false>
               *v)

{
  long *plVar1;
  CodeGeneratorData *codegen;
  _Head_base<0UL,_unsigned_char_*,_false> _Var2;
  const_iterator __begin1;
  long *plVar3;
  _Head_base<0UL,_unsigned_char_*,_false> _Var4;
  const_iterator __end1;
  ulong uVar5;
  
  plVar3 = *(long **)((long)&(v->
                             super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_CompiledScmHeader,_CustomHeaderOATC>,_false,_true>
                             ).
                             super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_CompiledScmHeader,_CustomHeaderOATC>,_true,_true>
                             .
                             super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_CompiledScmHeader,_CustomHeaderOATC>,_false>
                             .field_0 + 8);
  plVar1 = *(long **)((long)&(v->
                             super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_CompiledScmHeader,_CustomHeaderOATC>,_false,_true>
                             ).
                             super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_CompiledScmHeader,_CustomHeaderOATC>,_true,_true>
                             .
                             super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_CompiledScmHeader,_CustomHeaderOATC>,_false>
                             .field_0 + 0x10);
  codegen = f->this;
  uVar5 = ((long)plVar1 - (long)plVar3 >> 4) * 0xc + 0x14;
  for (; plVar1 != plVar3; plVar3 = plVar3 + 2) {
    uVar5 = uVar5 + *(long *)(*plVar3 + 0x1b0) + 1;
  }
  _Var4._M_head_impl = (uchar *)operator_new__(uVar5);
  _Var2._M_head_impl =
       (codegen->bw).bytecode._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  (codegen->bw).bytecode._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var2._M_head_impl != (uchar *)0x0) {
    operator_delete__(_Var2._M_head_impl);
  }
  (codegen->bw).offset = 0;
  (codegen->bw).max_offset = uVar5;
  CustomHeaderOATC::generate_code((CustomHeaderOATC *)v,codegen);
  return;
}

Assistant:

static EGGS_CXX11_CONSTEXPR R call(F&& f, Ms... ms, V&& v)
        {
            return _invoke_guard<R>{}(
                detail::forward<F>(f), detail::forward<Ms>(ms)...
              , _apply_get<V, I>{}(v));
        }